

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textureinfo.h
# Opt level: O0

PvrLegacyHeader * __thiscall PvrLegacyHeader::ToString_abi_cxx11_(PvrLegacyHeader *this)

{
  ulong uVar1;
  size_type sVar2;
  reference __rhs;
  PvrLegacyHeader *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78 [36];
  uint local_54;
  undefined1 local_50 [4];
  uint index;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_38;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *variable_strings;
  allocator local_1a;
  byte local_19;
  PvrLegacyHeader *this_local;
  string *output;
  
  local_19 = 0;
  this_local = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,"",&local_1a);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a);
  ToStringArray_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_50,in_RSI);
  local_38 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_50;
  local_54 = 0;
  while( true ) {
    uVar1 = (ulong)local_54;
    sVar2 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)PvrLegacyInfo::column_names_abi_cxx11_);
    if (sVar2 <= uVar1) break;
    __rhs = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::at((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)PvrLegacyInfo::column_names_abi_cxx11_,(ulong)local_54);
    std::operator+(local_b8,(char *)__rhs);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::at(local_38,(ulong)local_54);
    std::operator+(local_98,local_b8);
    std::operator+(local_78,(char *)local_98);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)local_b8);
    local_54 = local_54 + 1;
  }
  local_19 = 1;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_50);
  if ((local_19 & 1) == 0) {
    std::__cxx11::string::~string((string *)this);
  }
  return this;
}

Assistant:

virtual std::string ToString() {
    std::string output("");
    const auto& variable_strings(this->ToStringArray());
    for(unsigned int index=0; index<PvrLegacyInfo::column_names.size();++index)
      output.append(PvrLegacyInfo::column_names.at(index) + ": " + variable_strings.at(index) + "\n");
    return output;
  }